

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O1

ssize_t send_all(int fd,msghdr *msg,int flags)

{
  uint uVar1;
  ssize_t sVar2;
  ulong uVar3;
  
  if (msg->msg_iovlen == 0) {
    sVar2 = 0;
  }
  else {
    uVar1 = 1;
    uVar3 = 0;
    sVar2 = 0;
    do {
      memcpy(send_buffer + sVar2,msg->msg_iov[uVar3].iov_base,msg->msg_iov[uVar3].iov_len);
      sVar2 = sVar2 + msg->msg_iov[uVar3].iov_len;
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar3 < msg->msg_iovlen);
  }
  return sVar2;
}

Assistant:

static ssize_t send_all(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	ssize_t len = 0;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, msg->msg_iov[i].iov_len);
		len += (ssize_t)msg->msg_iov[i].iov_len;
	}

	return len;
}